

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadCustomSection
          (BinaryReader *this,Index section_index,Offset section_size)

{
  bool bVar1;
  size_t sVar2;
  Offset OVar3;
  size_t sVar4;
  Result RVar5;
  int iVar6;
  size_type sVar7;
  Enum EVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  uint uVar13;
  size_type __rlen;
  ulong uVar14;
  bool bVar15;
  string_view name;
  uint32_t table_size;
  Index function_index;
  uint32_t mem_align;
  Index local_index;
  uint32_t table_align;
  uint32_t value;
  uint32_t mem_size;
  string_view section_name;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint32_t local_a0;
  uint local_9c;
  string_view local_98;
  Offset local_88;
  uint local_80;
  uint local_7c;
  ulong local_78;
  uint local_6c;
  string_view local_68;
  uint local_4c;
  string_view local_48;
  uint local_34;
  
  local_48._M_len = 0;
  local_48._M_str = (char *)0x0;
  RVar5 = ReadStr(this,&local_48,"section name");
  if (RVar5.enum_ == Error) {
    return (Result)Error;
  }
  iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                    (this->delegate_,(ulong)section_index,section_size,local_48._M_len,
                     local_48._M_str);
  pcVar11 = local_48._M_str;
  sVar4 = local_48._M_len;
  if (iVar6 != 0) {
    PrintError(this,"BeginCustomSection callback failed");
    return (Result)Error;
  }
  bVar1 = this->reading_custom_section_;
  this->reading_custom_section_ = true;
  local_88 = (this->state_).offset;
  local_98._M_len = (size_t)(this->state_).data;
  local_98._M_str = (char *)(this->state_).size;
  iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])(this->delegate_,section_size);
  if (iVar6 == 0) {
    sVar2 = this->read_end_;
    OVar3 = (this->state_).offset;
    (this->state_).offset = sVar2;
    iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[199])
                      (this->delegate_,sVar4,pcVar11,(this->state_).data + OVar3,sVar2 - OVar3);
    if (iVar6 != 0) {
      pcVar11 = "OnGenericCustomSection callback failed";
      goto LAB_00128194;
    }
    iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[200])();
    if (iVar6 != 0) {
      pcVar11 = "EndGenericCustomSection callback failed";
      goto LAB_00128194;
    }
    (this->state_).offset = local_88;
    (this->state_).data = (uint8_t *)local_98._M_len;
    (this->state_).size = (Offset)local_98._M_str;
    if (((this->options_->read_debug_names == true) && (local_48._M_len == 4)) &&
       (iVar6 = bcmp(local_48._M_str,"name",4), iVar6 == 0)) {
      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa7])(this->delegate_,section_size);
      if (iVar6 == 0) {
        local_a4 = 0;
        local_7c = 0;
        do {
          if (this->read_end_ <= (this->state_).offset) {
            iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb4])();
            if (iVar6 == 0) {
              this->did_read_names_section_ = true;
              goto LAB_00128460;
            }
            pcVar11 = "EndNamesSection callback failed";
            goto LAB_00128475;
          }
          RVar5 = ReadU32Leb128(this,&local_b0,"name type");
          if (RVar5.enum_ != Error) {
            if (local_7c == 0) {
LAB_0012893b:
              local_a4 = local_b0;
              RVar5 = ReadU32Leb128(this,(uint32_t *)&local_98,"subsection size");
              uVar13 = local_b0;
              uVar12 = local_98._M_len & 0xffffffff;
              if (RVar5.enum_ == Error) {
                bVar15 = false;
              }
              else {
                uVar14 = (this->state_).offset + uVar12;
                uVar10 = this->read_end_;
                if (uVar10 < uVar14) {
                  bVar15 = false;
                  PrintError(this,"invalid sub-section size: extends past end");
                }
                else {
                  this->read_end_ = uVar14;
                  if (((int)local_b0 < 0xc) &&
                     (iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])
                                        (this->delegate_,(ulong)local_7c,(ulong)local_b0,uVar12),
                     iVar6 != 0)) {
                    bVar15 = false;
                    PrintError(this,"OnNameSubsection callback failed");
                  }
                  else {
                    local_78 = uVar10;
                    switch(uVar13) {
                    case 0:
                      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa8])
                                        (this->delegate_,(ulong)local_7c,(ulong)local_b0,uVar12);
                      if (iVar6 != 0) {
                        pcVar11 = "OnModuleNameSubsection callback failed";
LAB_00128ad1:
                        bVar15 = false;
                        PrintError(this,pcVar11);
                        uVar10 = local_78;
                        goto LAB_00128b8a;
                      }
                      if (uVar12 != 0) {
                        local_98._M_len = 0;
                        local_98._M_str = (char *)0x0;
                        RVar5 = ReadStr(this,&local_98,"module name");
                        if (RVar5.enum_ == Error) goto LAB_00128a3e;
                        iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa9])
                                          (this->delegate_,local_98._M_len,local_98._M_str);
                        if (iVar6 != 0) {
                          pcVar11 = "OnModuleName callback failed";
                          goto LAB_00128a37;
                        }
                      }
                      break;
                    case 1:
                      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaa])
                                        (this->delegate_,(ulong)local_7c,(ulong)local_b0,uVar12);
                      if (iVar6 != 0) {
                        pcVar11 = "OnFunctionNameSubsection callback failed";
                        goto LAB_00128ad1;
                      }
                      if (uVar12 != 0) {
                        RVar5 = ReadCount(this,&local_b8,"name count");
                        uVar13 = local_b8;
                        if (RVar5.enum_ == Error) goto LAB_00128a3e;
                        iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xab])();
                        if (iVar6 != 0) {
                          pcVar11 = "OnFunctionNamesCount callback failed";
                          goto LAB_00128a37;
                        }
                        if (uVar13 != 0) {
                          local_ac = 0xffffffff;
                          do {
                            local_98._M_len = 0;
                            local_98._M_str = (char *)0x0;
                            RVar5 = ReadU32Leb128(this,(uint32_t *)&local_68,"function index");
                            bVar15 = false;
                            if (RVar5.enum_ != Error) {
                              local_b4 = (uint)local_68._M_len;
                              if ((uint)local_68._M_len == local_ac) {
                                pcVar11 = "duplicate function name: %u";
                              }
                              else {
                                if (local_ac < (uint)local_68._M_len || local_ac == 0xffffffff) {
                                  if ((uint)local_68._M_len <
                                      this->num_function_signatures_ + this->num_func_imports_) {
                                    RVar5 = ReadStr(this,&local_98,"function name");
                                    if (RVar5.enum_ == Error) {
                                      bVar15 = false;
                                    }
                                    else {
                                      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xac])
                                                        (this->delegate_,(ulong)local_b4,
                                                         local_98._M_len,local_98._M_str);
                                      if (iVar6 == 0) {
                                        bVar15 = true;
                                      }
                                      else {
                                        bVar15 = false;
                                        PrintError(this,"OnFunctionName callback failed");
                                      }
                                    }
                                  }
                                  else {
                                    bVar15 = false;
                                    PrintError(this,"invalid function index: %u",
                                               local_68._M_len & 0xffffffff);
                                  }
                                  local_ac = local_b4;
                                  goto LAB_00128fba;
                                }
                                pcVar11 = "function index out of order: %u";
                              }
                              bVar15 = false;
                              PrintError(this,pcVar11,local_68._M_len & 0xffffffff);
                            }
LAB_00128fba:
                            if (!bVar15) goto LAB_00128a3e;
                            uVar13 = uVar13 - 1;
                          } while (uVar13 != 0);
                        }
                      }
                      break;
                    case 2:
                      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xad])
                                        (this->delegate_,(ulong)local_7c,(ulong)local_b0,uVar12);
                      if (iVar6 != 0) {
                        pcVar11 = "OnLocalNameSubsection callback failed";
                        goto LAB_00128ad1;
                      }
                      if (uVar12 != 0) {
                        RVar5 = ReadCount(this,&local_b8,"function count");
                        if (RVar5.enum_ == Error) goto LAB_00128a3e;
                        local_ac = local_b8;
                        iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xae])();
                        if (iVar6 != 0) {
                          pcVar11 = "OnLocalNameFunctionCount callback failed";
                          goto LAB_00128a37;
                        }
                        if (local_ac != 0) {
                          uVar13 = 0;
                          local_80 = 0xffffffff;
                          do {
                            RVar5 = ReadU32Leb128(this,(uint32_t *)&local_98,"function index");
                            bVar15 = false;
                            if (RVar5.enum_ != Error) {
                              local_9c = (uint)local_98._M_len;
                              if ((uint)local_98._M_len <
                                  this->num_function_signatures_ + this->num_func_imports_) {
                                if (local_80 < (uint)local_98._M_len || local_80 == 0xffffffff) {
                                  RVar5 = ReadCount(this,&local_a0,"local count");
                                  if (RVar5.enum_ == Error) {
                                    bVar15 = false;
                                  }
                                  else {
                                    local_80 = local_a0;
                                    iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                                                      (this->delegate_,(ulong)local_9c);
                                    if (iVar6 == 0) {
                                      bVar15 = local_80 == 0;
                                      if (!bVar15) {
                                        local_6c = 0xffffffff;
                                        do {
                                          local_80 = local_80 - 1;
                                          local_98._M_len = 0;
                                          local_98._M_str = (char *)0x0;
                                          RVar5 = ReadU32Leb128(this,(uint32_t *)&local_68,
                                                                "named index");
                                          bVar15 = false;
                                          if (RVar5.enum_ != Error) {
                                            local_a8 = (uint)local_68._M_len;
                                            if ((uint)local_68._M_len == local_6c) {
                                              pcVar11 = "duplicate local index: %u";
                                            }
                                            else {
                                              if (local_6c < (uint)local_68._M_len ||
                                                  local_6c == 0xffffffff) {
                                                RVar5 = ReadStr(this,&local_98,"name");
                                                if (RVar5.enum_ == Error) {
                                                  bVar15 = false;
                                                }
                                                else {
                                                  iVar6 = (*this->delegate_->
                                                            _vptr_BinaryReaderDelegate[0xb0])
                                                                    (this->delegate_,(ulong)local_9c
                                                                     ,(ulong)local_a8,
                                                                     local_98._M_len,local_98._M_str
                                                                    );
                                                  if (iVar6 == 0) {
                                                    bVar15 = true;
                                                  }
                                                  else {
                                                    bVar15 = false;
                                                    PrintError(this,"OnLocalName callback failed");
                                                  }
                                                }
                                                local_6c = local_a8;
                                                goto LAB_00128e88;
                                              }
                                              pcVar11 = "local index out of order: %u";
                                            }
                                            bVar15 = false;
                                            PrintError(this,pcVar11,local_68._M_len & 0xffffffff);
                                          }
LAB_00128e88:
                                        } while ((bVar15) && (local_80 != 0));
                                      }
                                    }
                                    else {
                                      bVar15 = false;
                                      PrintError(this,"OnLocalNameLocalCount callback failed");
                                    }
                                  }
                                  local_80 = local_9c;
                                  goto LAB_00128d7b;
                                }
                                pcVar11 = "locals function index out of order: %u";
                              }
                              else {
                                pcVar11 = "invalid function index: %u";
                              }
                              bVar15 = false;
                              PrintError(this,pcVar11,local_98._M_len & 0xffffffff);
                            }
LAB_00128d7b:
                            if (!bVar15) goto LAB_00128a3e;
                            uVar13 = uVar13 + 1;
                          } while (uVar13 != local_ac);
                        }
                      }
                      break;
                    case 4:
                    case 5:
                    case 6:
                    case 7:
                    case 8:
                    case 9:
                    case 0xb:
                      if (uVar12 != 0) {
                        RVar5 = ReadCount(this,&local_b8,"name count");
                        uVar9 = local_b8;
                        if (RVar5.enum_ != Error) {
                          iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb2])
                                            (this->delegate_,(ulong)local_b8);
                          if (iVar6 == 0) {
                            for (; uVar9 != 0; uVar9 = uVar9 - 1) {
                              local_98._M_len = 0;
                              local_98._M_str = (char *)0x0;
                              RVar5 = ReadU32Leb128(this,(uint32_t *)&local_68,"index");
                              if (RVar5.enum_ == Error) goto LAB_00128a3e;
                              local_34 = (uint)local_68._M_len;
                              RVar5 = ReadStr(this,&local_98,"name");
                              if (RVar5.enum_ == Error) goto LAB_00128a3e;
                              iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb3])
                                                (this->delegate_,(ulong)uVar13,(ulong)local_34,
                                                 local_98._M_len,local_98._M_str);
                              if (iVar6 != 0) {
                                pcVar11 = "OnNameEntry callback failed";
                                goto LAB_00128a37;
                              }
                            }
                            goto switchD_001289f1_caseD_3;
                          }
                          pcVar11 = "OnNameCount callback failed";
LAB_00128a37:
                          PrintError(this,pcVar11);
                        }
LAB_00128a3e:
                        bVar15 = false;
                        uVar10 = local_78;
                        goto LAB_00128b8a;
                      }
                    default:
switchD_001289f1_caseD_3:
                      (this->state_).offset = uVar14;
                    }
                    local_7c = local_7c + 1;
                    bVar15 = true;
                    uVar10 = local_78;
                    if ((this->state_).offset != uVar14) {
                      bVar15 = false;
                      PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar14);
                      uVar10 = local_78;
                    }
                  }
LAB_00128b8a:
                  this->read_end_ = uVar10;
                }
              }
              goto LAB_00128929;
            }
            if (local_b0 == local_a4) {
              pcVar11 = "duplicate sub-section";
            }
            else {
              if (local_a4 <= local_b0) goto LAB_0012893b;
              pcVar11 = "out-of-order sub-section";
            }
            PrintError(this,pcVar11);
          }
          bVar15 = false;
LAB_00128929:
          EVar8 = Error;
        } while (bVar15);
        goto LAB_001281b5;
      }
      pcVar11 = "BeginNamesSection callback failed";
      goto LAB_00128475;
    }
    if (local_48._M_len == 6) {
      iVar6 = bcmp(local_48._M_str,"dylink",6);
      if (iVar6 != 0) goto LAB_00128263;
      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])(this->delegate_,section_size);
      if (iVar6 != 0) goto LAB_001283f1;
      RVar5 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_size");
      if (((RVar5.enum_ != Error) &&
          (RVar5 = ReadU32Leb128(this,&local_b0,"mem_align"), RVar5.enum_ != Error)) &&
         ((RVar5 = ReadU32Leb128(this,&local_b8,"table_size"), RVar5.enum_ != Error &&
          (RVar5 = ReadU32Leb128(this,&local_a0,"table_align"), RVar5.enum_ != Error)))) {
        iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                          (this->delegate_,local_68._M_len & 0xffffffff,(ulong)local_b0,
                           (ulong)local_b8,(ulong)local_a0);
        if (iVar6 != 0) {
          pcVar11 = "OnDylinkInfo callback failed";
          goto LAB_00128475;
        }
        RVar5 = ReadU32Leb128(this,&local_4c,"needed_dynlibs");
        if (RVar5.enum_ == Error) goto LAB_001281b0;
        iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])
                          (this->delegate_,(ulong)local_4c);
        if (iVar6 == 0) {
          bVar15 = local_4c != 0;
          local_4c = local_4c - 1;
          if (bVar15) {
            do {
              local_98._M_len = 0;
              local_98._M_str = (char *)0x0;
              RVar5 = ReadStr(this,&local_98,"dylib so_name");
              if (RVar5.enum_ == Error) goto LAB_001281b0;
              iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])
                                (this->delegate_,local_98._M_len,local_98._M_str);
              if (iVar6 != 0) {
                pcVar11 = "OnDylinkNeeded callback failed";
                goto LAB_00128475;
              }
              bVar15 = local_4c != 0;
              local_4c = local_4c - 1;
            } while (bVar15);
          }
LAB_0012908b:
          iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc1])();
          if (iVar6 != 0) {
            pcVar11 = "EndDylinkSection callback failed";
            goto LAB_00128475;
          }
          goto LAB_00128460;
        }
        pcVar11 = "OnDylinkNeededCount callback failed";
        goto LAB_00128475;
      }
    }
    else {
      if ((local_48._M_len == 8) && (iVar6 = bcmp(local_48._M_str,"dylink.0",8), iVar6 == 0)) {
        iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])(this->delegate_,section_size);
        if (iVar6 == 0) {
          do {
            if (this->read_end_ <= (this->state_).offset) goto LAB_0012908b;
            RVar5 = ReadU32Leb128(this,&local_b0,"type");
            if (RVar5.enum_ == Error) {
              bVar15 = false;
              goto LAB_0012889f;
            }
            RVar5 = ReadU32Leb128(this,(uint32_t *)&local_98,"subsection size");
            if (RVar5.enum_ == Error) {
              bVar15 = false;
              goto LAB_0012889f;
            }
            uVar10 = (this->state_).offset + (local_98._M_len & 0xffffffff);
            uVar12 = this->read_end_;
            if (uVar12 < uVar10) {
              bVar15 = false;
              PrintError(this,"invalid sub-section size: extends past end");
              goto LAB_0012889f;
            }
            this->read_end_ = uVar10;
            switch(local_b0) {
            case 1:
              RVar5 = ReadU32Leb128(this,(uint32_t *)&local_98,"mem_size");
              if (((RVar5.enum_ != Error) &&
                  (RVar5 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_align"),
                  RVar5.enum_ != Error)) &&
                 ((RVar5 = ReadU32Leb128(this,&local_b8,"table_size"), RVar5.enum_ != Error &&
                  (RVar5 = ReadU32Leb128(this,&local_a0,"table_align"), RVar5.enum_ != Error)))) {
                iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                                  (this->delegate_,local_98._M_len & 0xffffffff,
                                   local_68._M_len & 0xffffffff,(ulong)local_b8,(ulong)local_a0);
                if (iVar6 == 0) goto LAB_00128702;
                pcVar11 = "OnDylinkInfo callback failed";
LAB_001286f2:
                PrintError(this,pcVar11);
              }
              break;
            case 2:
              RVar5 = ReadU32Leb128(this,&local_b8,"needed_dynlibs");
              if (RVar5.enum_ == Error) break;
              iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])
                                (this->delegate_,(ulong)local_b8);
              if (iVar6 == 0) {
                do {
                  bVar15 = local_b8 == 0;
                  local_b8 = local_b8 - 1;
                  if (bVar15) goto LAB_00128702;
                  local_98._M_len = 0;
                  local_98._M_str = (char *)0x0;
                  RVar5 = ReadStr(this,&local_98,"dylib so_name");
                  if (RVar5.enum_ == Error) goto LAB_00128899;
                  iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])
                                    (this->delegate_,local_98._M_len,local_98._M_str);
                } while (iVar6 == 0);
                pcVar11 = "OnDylinkNeeded callback failed";
                goto LAB_001286f2;
              }
              pcVar11 = "OnDylinkNeededCount callback failed";
LAB_00128696:
              bVar15 = false;
              PrintError(this,pcVar11);
              goto LAB_0012889c;
            case 3:
              RVar5 = ReadU32Leb128(this,&local_b8,"count");
              if (RVar5.enum_ != Error) {
                iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])
                                  (this->delegate_,(ulong)local_b8);
                if (iVar6 != 0) {
                  pcVar11 = "OnDylinkExportCount callback failed";
                  goto LAB_00128696;
                }
                local_a4 = CONCAT31(local_a4._1_3_,local_b8 != 0);
                if (local_b8 != 0) {
                  uVar13 = 0;
LAB_0012873d:
                  local_68._M_len = local_68._M_len & 0xffffffff00000000;
                  local_98._M_len = 0;
                  local_98._M_str = (char *)0x0;
                  RVar5 = ReadStr(this,&local_98,"name");
                  if ((RVar5.enum_ != Error) &&
                     (RVar5 = ReadU32Leb128(this,(uint32_t *)&local_68,"flags"),
                     RVar5.enum_ != Error)) {
                    iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])
                                      (this->delegate_,local_98._M_len,local_98._M_str,
                                       local_68._M_len & 0xffffffff);
                    if (iVar6 == 0) goto code_r0x001287aa;
                    pcVar11 = "OnDylinkExport callback failed";
LAB_00128887:
                    PrintError(this,pcVar11);
                  }
                }
LAB_0012888e:
                if ((local_a4 & 1) == 0) goto LAB_00128702;
              }
              break;
            case 4:
              RVar5 = ReadU32Leb128(this,&local_b8,"count");
              if (RVar5.enum_ != Error) {
                iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbb])
                                  (this->delegate_,(ulong)local_b8);
                if (iVar6 == 0) {
                  local_a4 = CONCAT31(local_a4._1_3_,local_b8 != 0);
                  if (local_b8 != 0) {
                    uVar13 = 0;
                    do {
                      local_a0 = 0;
                      local_98._M_len = 0;
                      local_98._M_str = (char *)0x0;
                      local_68._M_len = 0;
                      local_68._M_str = (char *)0x0;
                      RVar5 = ReadStr(this,&local_98,"module");
                      if (((RVar5.enum_ == Error) ||
                          (RVar5 = ReadStr(this,&local_68,"field"), RVar5.enum_ == Error)) ||
                         (RVar5 = ReadU32Leb128(this,&local_a0,"flags"), RVar5.enum_ == Error))
                      break;
                      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                        (this->delegate_,local_98._M_len,local_98._M_str,
                                         local_68._M_len,local_68._M_str,(ulong)local_a0);
                      if (iVar6 != 0) {
                        pcVar11 = "OnDylinkImport callback failed";
                        goto LAB_00128887;
                      }
                      uVar13 = uVar13 + 1;
                      local_a4 = CONCAT31(local_a4._1_3_,uVar13 < local_b8);
                    } while (uVar13 < local_b8);
                  }
                  goto LAB_0012888e;
                }
                pcVar11 = "OnDylinkImportCount callback failed";
                goto LAB_00128696;
              }
              break;
            default:
              (this->state_).offset = uVar10;
LAB_00128702:
              bVar15 = true;
              if ((this->state_).offset != uVar10) {
                bVar15 = false;
                PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar10);
              }
              goto LAB_0012889c;
            }
LAB_00128899:
            bVar15 = false;
LAB_0012889c:
            this->read_end_ = uVar12;
LAB_0012889f:
            EVar8 = Error;
          } while (bVar15);
          goto LAB_001281b5;
        }
LAB_001283f1:
        pcVar11 = "BeginDylinkSection callback failed";
        goto LAB_00128475;
      }
LAB_00128263:
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::rfind(&local_48,"reloc",0,5);
      if (sVar7 == 0) {
        RVar5 = ReadRelocSection(this,section_size);
LAB_00128452:
        EVar8 = Error;
        if (RVar5.enum_ == Error) goto LAB_001281b5;
      }
      else {
        if (local_48._M_len == 7) {
          iVar6 = bcmp(local_48._M_str,"linking",7);
          if (iVar6 != 0) goto LAB_001282d4;
          RVar5 = ReadLinkingSection(this,section_size);
          goto LAB_00128452;
        }
        if ((local_48._M_len == 0xf) &&
           (iVar6 = bcmp(local_48._M_str,"target_features",0xf), iVar6 == 0)) {
          RVar5 = ReadTargetFeaturesSections(this,section_size);
          goto LAB_00128452;
        }
LAB_001282d4:
        if (((this->options_->features).code_metadata_enabled_ == true) &&
           (sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              (&local_48,"metadata.code.",0,0xe), sVar7 == 0)) {
          name._M_str = local_48._M_str + 0xe;
          name._M_len = local_48._M_len - 0xe;
          RVar5 = ReadCodeMetadataSection(this,name,section_size);
          goto LAB_00128452;
        }
        (this->state_).offset = this->read_end_;
      }
LAB_00128460:
      iVar6 = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
      if (iVar6 == 0) {
        EVar8 = Ok;
        goto LAB_001281b5;
      }
      pcVar11 = "EndCustomSection callback failed";
LAB_00128475:
      PrintError(this,pcVar11);
    }
  }
  else {
    pcVar11 = "BeginGenericCustomSection callback failed";
LAB_00128194:
    PrintError(this,pcVar11);
    (this->state_).offset = local_88;
    (this->state_).data = (uint8_t *)local_98._M_len;
    (this->state_).size = (Offset)local_98._M_str;
  }
LAB_001281b0:
  EVar8 = Error;
LAB_001281b5:
  this->reading_custom_section_ = bVar1;
  return (Result)EVar8;
code_r0x001287aa:
  uVar13 = uVar13 + 1;
  local_a4 = CONCAT31(local_a4._1_3_,uVar13 < local_b8);
  if (uVar13 >= local_b8) goto LAB_0012888e;
  goto LAB_0012873d;
}

Assistant:

Result BinaryReader::ReadCustomSection(Index section_index,
                                       Offset section_size) {
  std::string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_index, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  {
    // Backtrack parser when scope ends
    ValueRestoreGuard<BinaryReaderDelegate::State, &BinaryReader::state_> guard(
        this);
    CHECK_RESULT(ReadGenericCustomSection(section_name, section_size));
  }

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK0) {
    CHECK_RESULT(ReadDylink0Section(section_size));
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_TARGET_FEATURES) {
    CHECK_RESULT(ReadTargetFeaturesSections(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.code_metadata_enabled() &&
             section_name.find(WABT_BINARY_SECTION_CODE_METADATA) == 0) {
    std::string_view metadata_name = section_name;
    metadata_name.remove_prefix(sizeof(WABT_BINARY_SECTION_CODE_METADATA) - 1);
    CHECK_RESULT(ReadCodeMetadataSection(metadata_name, section_size));
  } else {
    // Skip. This is a generic custom section, and is handled above.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}